

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.h
# Opt level: O1

bool jbcoin::operator==(STAmount *lhs,STAmount *rhs)

{
  long lVar1;
  
  if (lhs->mIsNative == rhs->mIsNative) {
    lVar1 = 0;
    do {
      if (*(char *)((long)(lhs->mIssue).currency.pn + lVar1) !=
          *(char *)((long)(rhs->mIssue).currency.pn + lVar1)) goto LAB_001a8c3f;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x14);
    lVar1 = 0x14;
LAB_001a8c3f:
    if (((lVar1 == 0x14) && (lhs->mIsNegative == rhs->mIsNegative)) &&
       (lhs->mOffset == rhs->mOffset)) {
      return lhs->mValue == rhs->mValue;
    }
  }
  return false;
}

Assistant:

std::uint64_t mantissa() const noexcept { return mValue; }